

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTCue_GetState(FACTCue *pCue,uint32_t *pdwState)

{
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI != 0) {
    FAudio_PlatformLockMutex((FAudioMutex)0x116910);
    *in_RSI = *(undefined4 *)(in_RDI + 0x3c);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x116935);
  }
  else {
    *in_RSI = 0;
  }
  local_4 = (uint)(in_RDI == 0);
  return local_4;
}

Assistant:

uint32_t FACTCue_GetState(FACTCue *pCue, uint32_t *pdwState)
{
	if (pCue == NULL)
	{
		*pdwState = 0;
		return 1;
	}
	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
	*pdwState = pCue->state;
	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}